

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDImporter.cpp
# Opt level: O3

aiMesh * __thiscall
Assimp::MMDImporter::CreateMesh(MMDImporter *this,PmxModel *pModel,int indexStart,int indexCount)

{
  PmxBone *pPVar1;
  size_t __n;
  float fVar2;
  float fVar3;
  float fVar4;
  PmxVertex *pPVar5;
  aiVector3D *paVar6;
  _Head_base<0UL,_pmx::PmxVertexSkinning_*,_false> _Var7;
  PmxBone *pPVar8;
  _Base_ptr p_Var9;
  aiMesh *paVar10;
  ulong *puVar11;
  aiFace *paVar12;
  int *piVar13;
  aiVector3D *paVar14;
  ulong uVar15;
  long lVar16;
  mapped_type *pmVar17;
  aiBone **ppaVar18;
  aiBone *paVar19;
  aiVertexWeight *__s;
  aiFace *paVar20;
  float *pfVar21;
  _Base_ptr p_Var22;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  int iVar27;
  _Base_ptr p_Var28;
  _Base_ptr p_Var29;
  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
  bone_vertex_map;
  aiVertexWeight local_98;
  ulong local_90;
  aiBone **local_88;
  size_t local_80;
  PmxModel *local_78;
  long local_70;
  ulong local_68;
  _Rb_tree<int,_std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
  local_60;
  
  local_80 = CONCAT44(local_80._4_4_,indexStart);
  paVar10 = (aiMesh *)operator_new(0x520);
  paVar10->mPrimitiveTypes = 0;
  memset(&paVar10->mVertices,0,0xcc);
  paVar10->mBones = (aiBone **)0x0;
  paVar10->mMaterialIndex = 0;
  (paVar10->mName).length = 0;
  (paVar10->mName).data[0] = '\0';
  memset((paVar10->mName).data + 1,0x1b,0x3ff);
  paVar10->mNumAnimMeshes = 0;
  paVar10->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar10->mMethod = 0;
  (paVar10->mAABB).mMin.x = 0.0;
  (paVar10->mAABB).mMin.y = 0.0;
  (paVar10->mAABB).mMin.z = 0.0;
  (paVar10->mAABB).mMax.x = 0.0;
  (paVar10->mAABB).mMax.y = 0.0;
  (paVar10->mAABB).mMax.z = 0.0;
  memset(paVar10->mColors,0,0xa0);
  paVar10->mNumVertices = indexCount;
  local_90 = CONCAT44(local_90._4_4_,indexCount);
  uVar24 = indexCount / 3;
  uVar25 = (ulong)uVar24;
  paVar10->mNumFaces = uVar24;
  puVar11 = (ulong *)operator_new__(uVar25 * 0x10 + 8);
  *puVar11 = uVar25;
  paVar12 = (aiFace *)(puVar11 + 1);
  if (indexCount + 2U < 5) {
    paVar10->mFaces = paVar12;
  }
  else {
    paVar20 = paVar12;
    do {
      paVar20->mNumIndices = 0;
      paVar20->mIndices = (uint *)0x0;
      paVar20 = paVar20 + 1;
    } while (paVar20 != paVar12 + uVar25);
    paVar10->mFaces = paVar12;
    if (4 < indexCount + 2U) {
      uVar25 = 1;
      if (1 < uVar24) {
        uVar25 = (ulong)uVar24;
      }
      lVar16 = 0;
      do {
        *(undefined4 *)(puVar11 + 1) = 3;
        piVar13 = (int *)operator_new__(0xc);
        iVar27 = (int)lVar16;
        *piVar13 = iVar27;
        piVar13[1] = iVar27 + 1;
        piVar13[2] = iVar27 + 2;
        puVar11[2] = (ulong)piVar13;
        lVar16 = lVar16 + 3;
        puVar11 = puVar11 + 2;
      } while (uVar25 * 3 != lVar16);
    }
  }
  iVar27 = (int)local_90;
  local_68 = local_90 & 0xffffffff;
  ppaVar18 = (aiBone **)(local_68 * 0xc);
  paVar14 = (aiVector3D *)operator_new__((ulong)ppaVar18);
  local_88 = ppaVar18;
  if (iVar27 == 0) {
    paVar10->mVertices = paVar14;
    paVar14 = (aiVector3D *)operator_new__((ulong)ppaVar18);
    paVar10->mNormals = paVar14;
    paVar14 = (aiVector3D *)operator_new__((ulong)ppaVar18);
  }
  else {
    __n = (((long)ppaVar18 - 0xcU) / 0xc) * 0xc + 0xc;
    memset(paVar14,0,__n);
    paVar10->mVertices = paVar14;
    paVar14 = (aiVector3D *)operator_new__((ulong)ppaVar18);
    memset(paVar14,0,__n);
    paVar10->mNormals = paVar14;
    paVar14 = (aiVector3D *)operator_new__((ulong)ppaVar18);
    memset(paVar14,0,__n);
  }
  paVar10->mTextureCoords[0] = paVar14;
  paVar10->mNumUVComponents[0] = 2;
  uVar25 = (ulong)(pModel->setting).uv;
  if (uVar25 != 0) {
    uVar15 = (long)local_88 - 0xc;
    uVar26 = 0;
    do {
      paVar14 = (aiVector3D *)operator_new__((ulong)local_88);
      if ((int)local_90 != 0) {
        memset(paVar14,0,(uVar15 / 0xc) * 0xc + 0xc);
      }
      paVar10->mTextureCoords[uVar26 + 1] = paVar14;
      paVar10->mNumUVComponents[uVar26 + 1] = 4;
      uVar26 = uVar26 + 1;
    } while (uVar25 != uVar26);
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < (int)local_90) {
    local_70 = (long)(int)local_80;
    uVar25 = 0;
    do {
      iVar27 = (pModel->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
               super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl[uVar25 + local_70];
      pPVar5 = (pModel->vertices)._M_t.
               super___uniq_ptr_impl<pmx::PmxVertex,_std::default_delete<pmx::PmxVertex[]>_>._M_t.
               super__Tuple_impl<0UL,_pmx::PmxVertex_*,_std::default_delete<pmx::PmxVertex[]>_>.
               super__Head_base<0UL,_pmx::PmxVertex_*,_false>._M_head_impl;
      paVar6 = paVar10->mVertices;
      fVar2 = pPVar5[iVar27].position[2];
      fVar3 = pPVar5[iVar27].position[1];
      paVar14 = paVar6 + uVar25;
      paVar14->x = pPVar5[iVar27].position[0];
      paVar14->y = fVar3;
      paVar6[uVar25].z = fVar2;
      paVar6 = paVar10->mNormals;
      fVar2 = pPVar5[iVar27].normal[2];
      fVar3 = pPVar5[iVar27].normal[1];
      paVar14 = paVar6 + uVar25;
      paVar14->x = pPVar5[iVar27].normal[0];
      paVar14->y = fVar3;
      paVar6[uVar25].z = fVar2;
      paVar14 = paVar10->mTextureCoords[0];
      paVar14[uVar25].x = pPVar5[iVar27].uv[0];
      paVar14[uVar25].y = pPVar5[iVar27].uv[1];
      if ((pModel->setting).uv != '\0') {
        pfVar21 = (float *)((long)(pPVar5[iVar27].uva + 1) + 4);
        uVar15 = 0;
        do {
          paVar14 = paVar10->mTextureCoords[uVar15 + 1];
          paVar14[uVar25].x = (*(float (*) [4])(pfVar21 + -1))[0];
          paVar14[uVar25].y = *pfVar21;
          uVar15 = uVar15 + 1;
          pfVar21 = pfVar21 + 4;
        } while (uVar15 < (pModel->setting).uv);
      }
      _Var7._M_head_impl =
           *(PmxVertexSkinning **)
            &pPVar5[iVar27].skinning._M_t.
             super___uniq_ptr_impl<pmx::PmxVertexSkinning,_std::default_delete<pmx::PmxVertexSkinning>_>
      ;
      if ((tuple<pmx::PmxVertexSkinning_*,_std::default_delete<pmx::PmxVertexSkinning>_>)
          _Var7._M_head_impl == (_Head_base<0UL,_pmx::PmxVertexSkinning_*,_false>)0x0) {
        local_90 = 0;
        local_80 = 0;
        local_88 = (aiBone **)0x0;
        lVar16 = 0;
      }
      else {
        local_80 = __dynamic_cast(_Var7._M_head_impl,&pmx::PmxVertexSkinning::typeinfo,
                                  &pmx::PmxVertexSkinningBDEF1::typeinfo,0);
        local_88 = (aiBone **)
                   __dynamic_cast(_Var7._M_head_impl,&pmx::PmxVertexSkinning::typeinfo,
                                  &pmx::PmxVertexSkinningBDEF2::typeinfo,0);
        local_90 = __dynamic_cast(_Var7._M_head_impl,&pmx::PmxVertexSkinning::typeinfo,
                                  &pmx::PmxVertexSkinningBDEF4::typeinfo,0);
        lVar16 = __dynamic_cast(_Var7._M_head_impl,&pmx::PmxVertexSkinning::typeinfo,
                                &pmx::PmxVertexSkinningSDEF::typeinfo,0);
      }
      ppaVar18 = local_88;
      uVar15 = local_90;
      uVar24 = (uint)uVar25;
      switch(pPVar5[iVar27].skinning_type) {
      case BDEF1:
        pmVar17 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)(local_80 + 8));
        local_98.mWeight = 1.0;
        local_98.mVertexId = uVar24;
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                  (pmVar17,&local_98);
        break;
      case BDEF2:
        pmVar17 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)(local_88 + 1));
        local_98.mWeight = *(float *)(ppaVar18 + 2);
        local_98.mVertexId = uVar24;
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                  (pmVar17,&local_98);
        pmVar17 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)((long)ppaVar18 + 0xc));
        local_98.mWeight = 1.0 - *(float *)(ppaVar18 + 2);
        local_98.mVertexId = uVar24;
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                  (pmVar17,&local_98);
        break;
      case BDEF4:
        pmVar17 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)(local_90 + 8));
        local_98.mWeight = *(float *)(uVar15 + 0x18);
        local_98.mVertexId = uVar24;
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                  (pmVar17,&local_98);
        pmVar17 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)(uVar15 + 0xc));
        local_98.mWeight = *(float *)(uVar15 + 0x1c);
        local_98.mVertexId = uVar24;
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                  (pmVar17,&local_98);
        pmVar17 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)(uVar15 + 0x10));
        local_98.mWeight = *(float *)(uVar15 + 0x20);
        local_98.mVertexId = uVar24;
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                  (pmVar17,&local_98);
        pmVar17 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)(uVar15 + 0x14));
        local_98.mWeight = *(float *)(uVar15 + 0x24);
        local_98.mVertexId = uVar24;
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                  (pmVar17,&local_98);
        break;
      case SDEF:
        pmVar17 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)(lVar16 + 8));
        local_98.mWeight = *(float *)(lVar16 + 0x10);
        local_98.mVertexId = uVar24;
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                  (pmVar17,&local_98);
        pmVar17 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)(lVar16 + 0xc));
        local_98.mWeight = 1.0 - *(float *)(lVar16 + 0x10);
        local_98.mVertexId = uVar24;
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                  (pmVar17,&local_98);
        break;
      case QDEF:
        if ((_Head_base<0UL,_pmx::PmxVertexSkinning_*,_false>)_Var7._M_head_impl ==
            (_Head_base<0UL,_pmx::PmxVertexSkinning_*,_false>)0x0) {
          lVar16 = 0;
        }
        else {
          lVar16 = __dynamic_cast(_Var7._M_head_impl,&pmx::PmxVertexSkinning::typeinfo,
                                  &pmx::PmxVertexSkinningQDEF::typeinfo,0);
        }
        pmVar17 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)(lVar16 + 8));
        local_98.mWeight = *(float *)(lVar16 + 0x18);
        local_98.mVertexId = uVar24;
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                  (pmVar17,&local_98);
        pmVar17 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)(lVar16 + 0xc));
        local_98.mWeight = *(float *)(lVar16 + 0x1c);
        local_98.mVertexId = uVar24;
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                  (pmVar17,&local_98);
        pmVar17 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)(lVar16 + 0x10));
        local_98.mWeight = *(float *)(lVar16 + 0x20);
        local_98.mVertexId = uVar24;
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                  (pmVar17,&local_98);
        pmVar17 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)(lVar16 + 0x14));
        local_98.mWeight = *(float *)(lVar16 + 0x24);
        local_98.mVertexId = uVar24;
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                  (pmVar17,&local_98);
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 != local_68);
  }
  uVar24 = pModel->bone_count;
  uVar15 = (ulong)(int)uVar24;
  uVar25 = 0xffffffffffffffff;
  if (-1 < (long)uVar15) {
    uVar25 = uVar15 * 8;
  }
  ppaVar18 = (aiBone **)operator_new__(uVar25);
  paVar10->mNumBones = uVar24;
  paVar10->mBones = ppaVar18;
  if (0 < (int)uVar24) {
    lVar16 = 0;
    local_90 = uVar15;
    local_88 = ppaVar18;
    local_78 = pModel;
    do {
      paVar19 = (aiBone *)operator_new(0x450);
      (paVar19->mName).length = 0;
      (paVar19->mName).data[0] = '\0';
      memset((paVar19->mName).data + 1,0x1b,0x3ff);
      paVar19->mNumWeights = 0;
      paVar19->mWeights = (aiVertexWeight *)0x0;
      (paVar19->mOffsetMatrix).a1 = 1.0;
      (paVar19->mOffsetMatrix).a2 = 0.0;
      (paVar19->mOffsetMatrix).a3 = 0.0;
      (paVar19->mOffsetMatrix).a4 = 0.0;
      (paVar19->mOffsetMatrix).b1 = 0.0;
      (paVar19->mOffsetMatrix).b2 = 1.0;
      (paVar19->mOffsetMatrix).b3 = 0.0;
      (paVar19->mOffsetMatrix).b4 = 0.0;
      (paVar19->mOffsetMatrix).c1 = 0.0;
      (paVar19->mOffsetMatrix).c2 = 0.0;
      (paVar19->mOffsetMatrix).c3 = 1.0;
      (paVar19->mOffsetMatrix).c4 = 0.0;
      (paVar19->mOffsetMatrix).d1 = 0.0;
      (paVar19->mOffsetMatrix).d2 = 0.0;
      (paVar19->mOffsetMatrix).d3 = 0.0;
      (paVar19->mOffsetMatrix).d4 = 1.0;
      pPVar8 = (pModel->bones)._M_t.
               super___uniq_ptr_impl<pmx::PmxBone,_std::default_delete<pmx::PmxBone[]>_>._M_t.
               super__Tuple_impl<0UL,_pmx::PmxBone_*,_std::default_delete<pmx::PmxBone[]>_>.
               super__Head_base<0UL,_pmx::PmxBone_*,_false>._M_head_impl;
      pPVar1 = pPVar8 + lVar16;
      uVar25 = pPVar8[lVar16].bone_name._M_string_length;
      if (uVar25 < 0x400) {
        (paVar19->mName).length = (ai_uint32)uVar25;
        memcpy((paVar19->mName).data,(pPVar1->bone_name)._M_dataplus._M_p,uVar25);
        (paVar19->mName).data[uVar25] = '\0';
      }
      fVar2 = pPVar1->position[0];
      fVar3 = pPVar1->position[1];
      fVar4 = pPVar1->position[2];
      (paVar19->mOffsetMatrix).a1 = 1.0;
      (paVar19->mOffsetMatrix).a2 = 0.0;
      (paVar19->mOffsetMatrix).a3 = 0.0;
      (paVar19->mOffsetMatrix).a4 = 0.0;
      (paVar19->mOffsetMatrix).b1 = 0.0;
      (paVar19->mOffsetMatrix).b2 = 1.0;
      (paVar19->mOffsetMatrix).b3 = 0.0;
      (paVar19->mOffsetMatrix).b4 = 0.0;
      (paVar19->mOffsetMatrix).c1 = 0.0;
      (paVar19->mOffsetMatrix).c2 = 0.0;
      (paVar19->mOffsetMatrix).c3 = 1.0;
      (paVar19->mOffsetMatrix).d3 = 0.0;
      (paVar19->mOffsetMatrix).d4 = 1.0;
      (paVar19->mOffsetMatrix).d1 = 0.0;
      (paVar19->mOffsetMatrix).d2 = 0.0;
      (paVar19->mOffsetMatrix).a4 = -fVar2;
      (paVar19->mOffsetMatrix).b4 = -fVar3;
      (paVar19->mOffsetMatrix).c4 = -fVar4;
      if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        p_Var9 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var29 = &local_60._M_impl.super__Rb_tree_header._M_header;
        do {
          p_Var28 = p_Var29;
          p_Var22 = p_Var9;
          lVar23 = (long)(int)p_Var22[1]._M_color;
          p_Var29 = p_Var22;
          if (lVar23 < lVar16) {
            p_Var29 = p_Var28;
          }
          p_Var9 = (&p_Var22->_M_left)[lVar23 < lVar16];
        } while ((&p_Var22->_M_left)[lVar23 < lVar16] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var29 != &local_60._M_impl.super__Rb_tree_header) {
          if (lVar23 < lVar16) {
            p_Var22 = p_Var28;
          }
          if ((int)p_Var22[1]._M_color <= lVar16) {
            uVar25 = (long)p_Var29[1]._M_left - (long)p_Var29[1]._M_parent >> 3;
            uVar24 = (uint)uVar25;
            paVar19->mNumWeights = uVar24;
            uVar25 = uVar25 & 0xffffffff;
            local_80 = uVar25 * 8;
            __s = (aiVertexWeight *)operator_new__(local_80);
            if (uVar25 != 0) {
              memset(__s,0,local_80);
            }
            paVar19->mWeights = __s;
            pModel = local_78;
            if (uVar24 != 0) {
              uVar25 = 0;
              do {
                paVar19->mWeights[uVar25] =
                     *(aiVertexWeight *)(&(p_Var29[1]._M_parent)->_M_color + uVar25 * 2);
                uVar25 = uVar25 + 1;
              } while (uVar25 < paVar19->mNumWeights);
              local_90 = (ulong)(uint)local_78->bone_count;
            }
          }
        }
      }
      local_88[lVar16] = paVar19;
      lVar16 = lVar16 + 1;
    } while (lVar16 < (int)local_90);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return paVar10;
}

Assistant:

aiMesh *MMDImporter::CreateMesh(const pmx::PmxModel *pModel,
                                const int indexStart, const int indexCount) {
  aiMesh *pMesh = new aiMesh;

  pMesh->mNumVertices = indexCount;

  pMesh->mNumFaces = indexCount / 3;
  pMesh->mFaces = new aiFace[pMesh->mNumFaces];

  const int numIndices = 3; // triangular face
  for (unsigned int index = 0; index < pMesh->mNumFaces; index++) {
    pMesh->mFaces[index].mNumIndices = numIndices;
    unsigned int *indices = new unsigned int[numIndices];
    indices[0] = numIndices * index;
    indices[1] = numIndices * index + 1;
    indices[2] = numIndices * index + 2;
    pMesh->mFaces[index].mIndices = indices;
  }

  pMesh->mVertices = new aiVector3D[pMesh->mNumVertices];
  pMesh->mNormals = new aiVector3D[pMesh->mNumVertices];
  pMesh->mTextureCoords[0] = new aiVector3D[pMesh->mNumVertices];
  pMesh->mNumUVComponents[0] = 2;

  // additional UVs
  for (int i = 1; i <= pModel->setting.uv; i++) {
    pMesh->mTextureCoords[i] = new aiVector3D[pMesh->mNumVertices];
    pMesh->mNumUVComponents[i] = 4;
  }

  map<int, vector<aiVertexWeight>> bone_vertex_map;

  // fill in contents and create bones
  for (int index = 0; index < indexCount; index++) {
    const pmx::PmxVertex *v =
        &pModel->vertices[pModel->indices[indexStart + index]];
    const float *position = v->position;
    pMesh->mVertices[index].Set(position[0], position[1], position[2]);
    const float *normal = v->normal;

    pMesh->mNormals[index].Set(normal[0], normal[1], normal[2]);
    pMesh->mTextureCoords[0][index].x = v->uv[0];
    pMesh->mTextureCoords[0][index].y = v->uv[1];

    for (int i = 1; i <= pModel->setting.uv; i++) {
      // TODO: wrong here? use quaternion transform?
      pMesh->mTextureCoords[i][index].x = v->uva[i][0];
      pMesh->mTextureCoords[i][index].y = v->uva[i][1];
    }

    // handle bone map
    const auto vsBDEF1_ptr =
        dynamic_cast<pmx::PmxVertexSkinningBDEF1 *>(v->skinning.get());
    const auto vsBDEF2_ptr =
        dynamic_cast<pmx::PmxVertexSkinningBDEF2 *>(v->skinning.get());
    const auto vsBDEF4_ptr =
        dynamic_cast<pmx::PmxVertexSkinningBDEF4 *>(v->skinning.get());
    const auto vsSDEF_ptr =
        dynamic_cast<pmx::PmxVertexSkinningSDEF *>(v->skinning.get());
    switch (v->skinning_type) {
    case pmx::PmxVertexSkinningType::BDEF1:
      bone_vertex_map[vsBDEF1_ptr->bone_index].push_back(
          aiVertexWeight(index, 1.0));
      break;
    case pmx::PmxVertexSkinningType::BDEF2:
      bone_vertex_map[vsBDEF2_ptr->bone_index1].push_back(
          aiVertexWeight(index, vsBDEF2_ptr->bone_weight));
      bone_vertex_map[vsBDEF2_ptr->bone_index2].push_back(
          aiVertexWeight(index, 1.0f - vsBDEF2_ptr->bone_weight));
      break;
    case pmx::PmxVertexSkinningType::BDEF4:
      bone_vertex_map[vsBDEF4_ptr->bone_index1].push_back(
          aiVertexWeight(index, vsBDEF4_ptr->bone_weight1));
      bone_vertex_map[vsBDEF4_ptr->bone_index2].push_back(
          aiVertexWeight(index, vsBDEF4_ptr->bone_weight2));
      bone_vertex_map[vsBDEF4_ptr->bone_index3].push_back(
          aiVertexWeight(index, vsBDEF4_ptr->bone_weight3));
      bone_vertex_map[vsBDEF4_ptr->bone_index4].push_back(
          aiVertexWeight(index, vsBDEF4_ptr->bone_weight4));
      break;
    case pmx::PmxVertexSkinningType::SDEF: // TODO: how to use sdef_c, sdef_r0,
                                           // sdef_r1?
      bone_vertex_map[vsSDEF_ptr->bone_index1].push_back(
          aiVertexWeight(index, vsSDEF_ptr->bone_weight));
      bone_vertex_map[vsSDEF_ptr->bone_index2].push_back(
          aiVertexWeight(index, 1.0f - vsSDEF_ptr->bone_weight));
      break;
    case pmx::PmxVertexSkinningType::QDEF:
      const auto vsQDEF_ptr =
          dynamic_cast<pmx::PmxVertexSkinningQDEF *>(v->skinning.get());
      bone_vertex_map[vsQDEF_ptr->bone_index1].push_back(
          aiVertexWeight(index, vsQDEF_ptr->bone_weight1));
      bone_vertex_map[vsQDEF_ptr->bone_index2].push_back(
          aiVertexWeight(index, vsQDEF_ptr->bone_weight2));
      bone_vertex_map[vsQDEF_ptr->bone_index3].push_back(
          aiVertexWeight(index, vsQDEF_ptr->bone_weight3));
      bone_vertex_map[vsQDEF_ptr->bone_index4].push_back(
          aiVertexWeight(index, vsQDEF_ptr->bone_weight4));
      break;
    }
  }

  // make all bones for each mesh
  // assign bone weights to skinned bones (otherwise just initialize)
  auto bone_ptr_ptr = new aiBone *[pModel->bone_count];
  pMesh->mNumBones = pModel->bone_count;
  pMesh->mBones = bone_ptr_ptr;
  for (auto ii = 0; ii < pModel->bone_count; ++ii) {
    auto pBone = new aiBone;
    const auto &pmxBone = pModel->bones[ii];
    pBone->mName = pmxBone.bone_name;
    aiVector3D pos(pmxBone.position[0], pmxBone.position[1], pmxBone.position[2]);
    aiMatrix4x4::Translation(-pos, pBone->mOffsetMatrix);
    auto it = bone_vertex_map.find(ii);
    if (it != bone_vertex_map.end()) {
      pBone->mNumWeights = static_cast<unsigned int>(it->second.size());
      pBone->mWeights = new aiVertexWeight[pBone->mNumWeights];
      for (unsigned int j = 0; j < pBone->mNumWeights; j++) {
          pBone->mWeights[j] = it->second[j];
      }
    }
    bone_ptr_ptr[ii] = pBone;
  }

  return pMesh;
}